

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O3

void Ree_ManRemoveContained(Gia_Man_t *p,Vec_Int_t *vAdds)

{
  uint uVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  Vec_Bit_t *__ptr;
  int iVar6;
  uint uVar7;
  int iVar8;
  
  __ptr = Ree_CollectInsiders(p,vAdds);
  uVar5 = vAdds->nSize;
  if ((int)uVar5 < 1) {
    iVar6 = 0;
  }
  else {
    uVar7 = 0;
    iVar8 = 0;
    iVar6 = 0;
    do {
      if ((int)uVar5 <= (int)(uVar7 + 2)) {
LAB_0066a8fa:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar2 = vAdds->pArray;
      if (piVar2[uVar7 + 2] == 0) {
        if (uVar5 <= uVar7 + 3) goto LAB_0066a8fa;
        uVar1 = piVar2[uVar7 + 3];
        if (((int)uVar1 < 0) || (__ptr->nSize <= (int)uVar1)) {
LAB_0066a919:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if (((uint)__ptr->pArray[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) == 0) goto LAB_0066a803;
        if (uVar5 <= uVar7 + 4) goto LAB_0066a8fa;
        uVar1 = piVar2[uVar7 + 4];
        if (((int)uVar1 < 0) || ((uint)__ptr->nSize <= uVar1)) goto LAB_0066a919;
        if (((uint)__ptr->pArray[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) == 0) goto LAB_0066a803;
      }
      else {
LAB_0066a803:
        uVar3 = *(undefined8 *)(piVar2 + uVar7);
        uVar4 = *(undefined8 *)(piVar2 + uVar7 + 2);
        *(undefined8 *)(piVar2 + (long)(iVar6 * 6) + 4) = *(undefined8 *)(piVar2 + (ulong)uVar7 + 4)
        ;
        *(undefined8 *)(piVar2 + iVar6 * 6) = uVar3;
        *(undefined8 *)(piVar2 + iVar6 * 6 + 2) = uVar4;
        uVar5 = vAdds->nSize;
        iVar6 = iVar6 + 1;
      }
      iVar8 = iVar8 + 1;
      uVar7 = uVar7 + 6;
    } while ((int)uVar7 < (int)uVar5);
    if (iVar8 < iVar6) {
      __assert_fail("k <= i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecRe.c"
                    ,0x227,"void Ree_ManRemoveContained(Gia_Man_t *, Vec_Int_t *)");
    }
  }
  if (SBORROW4(uVar5,iVar6 * 6) != (int)(uVar5 + iVar6 * -6) < 0) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vAdds->nSize = iVar6 * 6;
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return;
}

Assistant:

void Ree_ManRemoveContained( Gia_Man_t * p, Vec_Int_t * vAdds )
{
    Vec_Bit_t * vInsiders = Ree_CollectInsiders( p, vAdds );
    int i, k = 0;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
    {
        if ( Vec_IntEntry(vAdds, 6*i+2) == 0 ) // HADD
            if ( Vec_BitEntry(vInsiders, Vec_IntEntry(vAdds, 6*i+3)) && Vec_BitEntry(vInsiders, Vec_IntEntry(vAdds, 6*i+4)) )
                continue;
        memmove( Vec_IntArray(vAdds) + 6*k++, Vec_IntArray(vAdds) + 6*i, 6*sizeof(int) );
    }
    assert( k <= i );
    Vec_IntShrink( vAdds, 6*k );
    Vec_BitFree( vInsiders );
}